

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_setcond_i64_mips
               (TCGContext_conflict3 *tcg_ctx,TCGCond cond,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGCond cond_local;
  TCGContext_conflict3 *tcg_ctx_local;
  
  if (cond == TCG_COND_ALWAYS) {
    tcg_gen_movi_i64_mips(tcg_ctx,ret,1);
  }
  else if (cond == TCG_COND_NEVER) {
    tcg_gen_movi_i64_mips(tcg_ctx,ret,0);
  }
  else {
    tcg_gen_op4i_i64(tcg_ctx,INDEX_op_setcond_i64,ret,arg1,arg2,(ulong)cond);
  }
  return;
}

Assistant:

void tcg_gen_setcond_i64(TCGContext *tcg_ctx, TCGCond cond, TCGv_i64 ret,
                         TCGv_i64 arg1, TCGv_i64 arg2)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_movi_i64(tcg_ctx, ret, 1);
    } else if (cond == TCG_COND_NEVER) {
        tcg_gen_movi_i64(tcg_ctx, ret, 0);
    } else {
#if TCG_TARGET_REG_BITS == 32
            tcg_gen_op6i_i32(tcg_ctx, INDEX_op_setcond2_i32, TCGV_LOW(tcg_ctx, ret),
                             TCGV_LOW(tcg_ctx, arg1), TCGV_HIGH(tcg_ctx, arg1),
                             TCGV_LOW(tcg_ctx, arg2), TCGV_HIGH(tcg_ctx, arg2), cond);
            tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
#else
            tcg_gen_op4i_i64(tcg_ctx, INDEX_op_setcond_i64, ret, arg1, arg2, cond);
#endif
    }
}